

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

char * __thiscall cmMakefile::GetProperty(cmMakefile *this,string *prop,bool chain)

{
  cmLocalGenerator *pcVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  pointer pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  undefined1 local_68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  do {
    if ((GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') &&
       (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::
                                     output_abi_cxx11_), iVar5 != 0)) {
      GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2;
      GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
      GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2._M_local_buf[0] =
           '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    }
    std::__cxx11::string::assign
              ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    bVar4 = std::operator==(prop,"PARENT_DIRECTORY");
    if (bVar4) {
      cmState::Snapshot::GetBuildsystemDirectoryParent((Snapshot *)local_68,&this->StateSnapshot);
      bVar4 = cmState::Snapshot::IsValid((Snapshot *)local_68);
      if (!bVar4) {
        return "";
      }
      pcVar6 = cmState::Snapshot::GetCurrentSourceDirectory((Snapshot *)local_68);
      return pcVar6;
    }
    bVar4 = std::operator==(prop,"INCLUDE_REGULAR_EXPRESSION");
    if (bVar4) {
      std::__cxx11::string::assign
                ((char *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    bVar4 = std::operator==(prop,"LISTFILE_STACK");
    if (bVar4) {
      r = &this->ListFileStack;
LAB_0033d8d3:
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_68,r,";");
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    bVar4 = std::operator==(prop,"CACHE_VARIABLES");
    if (bVar4) {
      cmState::GetCacheEntryKeys_abi_cxx11_
                (&local_48,this->LocalGenerator->GlobalGenerator->CMakeInstance->State);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_68,&local_48,";");
LAB_0033d895:
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    bVar4 = std::operator==(prop,"VARIABLES");
    if (bVar4) {
      GetDefinitions_abi_cxx11_(&local_48,this);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_68,&local_48,";");
      goto LAB_0033d895;
    }
    bVar4 = std::operator==(prop,"MACROS");
    if (bVar4) {
      GetListOfMacros(this,&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
      return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
    }
    bVar4 = std::operator==(prop,"LINK_DIRECTORIES");
    if (bVar4) {
      r = &this->LinkDirectories;
      goto LAB_0033d8d3;
    }
    bVar4 = std::operator==(prop,"INCLUDE_DIRECTORIES");
    if (bVar4) {
      local_68._0_8_ = local_68 + 0x10;
      local_68._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
      local_68[0x10] = '\0';
      pcVar2 = (this->IncludeDirectoriesEntries).
               super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar7 = (this->IncludeDirectoriesEntries).
                    super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                    _M_impl.super__Vector_impl_data._M_start; pcVar7 != pcVar2; pcVar7 = pcVar7 + 1)
      {
        std::__cxx11::string::append
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
        std::__cxx11::string::append
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
        std::__cxx11::string::assign(local_68);
      }
LAB_0033da27:
      _Var3._M_p = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p
      ;
      std::__cxx11::string::~string((string *)local_68);
      return _Var3._M_p;
    }
    bVar4 = std::operator==(prop,"COMPILE_OPTIONS");
    if (bVar4) {
      local_68._0_8_ = local_68 + 0x10;
      local_68._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
      local_68[0x10] = '\0';
      pcVar2 = (this->CompileOptionsEntries).
               super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar7 = (this->CompileOptionsEntries).
                    super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                    _M_impl.super__Vector_impl_data._M_start; pcVar7 != pcVar2; pcVar7 = pcVar7 + 1)
      {
        std::__cxx11::string::append
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
        std::__cxx11::string::append
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
        std::__cxx11::string::assign(local_68);
      }
      goto LAB_0033da27;
    }
    bVar4 = std::operator==(prop,"COMPILE_DEFINITIONS");
    if (bVar4) {
      local_68._0_8_ = local_68 + 0x10;
      local_68._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
      local_68[0x10] = '\0';
      pcVar2 = (this->CompileDefinitionsEntries).
               super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar7 = (this->CompileDefinitionsEntries).
                    super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>.
                    _M_impl.super__Vector_impl_data._M_start; pcVar7 != pcVar2; pcVar7 = pcVar7 + 1)
      {
        std::__cxx11::string::append
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
        std::__cxx11::string::append
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
        std::__cxx11::string::assign(local_68);
      }
      goto LAB_0033da27;
    }
    pcVar6 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
    if ((~chain & 1U) != 0 || pcVar6 != (char *)0x0) {
      return pcVar6;
    }
    pcVar1 = this->LocalGenerator->Parent;
    if (pcVar1 == (cmLocalGenerator *)0x0) {
      pcVar6 = cmState::GetGlobalProperty
                         (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,prop);
      return pcVar6;
    }
    this = pcVar1->Makefile;
    chain = true;
  } while( true );
}

Assistant:

const char *cmMakefile::GetProperty(const std::string& prop,
                                    bool chain) const
{
  // watch for specific properties
  static std::string output;
  output = "";
  if (prop == "PARENT_DIRECTORY")
    {
    cmState::Snapshot parent =
        this->StateSnapshot.GetBuildsystemDirectoryParent();
    if(parent.IsValid())
      {
      return parent.GetCurrentSourceDirectory();
      }
    return "";
    }
  else if (prop == "INCLUDE_REGULAR_EXPRESSION" )
    {
    output = this->GetIncludeRegularExpression();
    return output.c_str();
    }
  else if (prop == "LISTFILE_STACK")
    {
    output = cmJoin(this->ListFileStack, ";");
    return output.c_str();
    }
  else if ( prop == "CACHE_VARIABLES" )
    {
    output = cmJoin(this->GetState()->GetCacheEntryKeys(), ";");
    return output.c_str();
    }
  else if (prop == "VARIABLES")
    {
    output = cmJoin(this->GetDefinitions(), ";");
    return output.c_str();
    }
  else if (prop == "MACROS")
    {
    this->GetListOfMacros(output);
    return output.c_str();
    }
  else if (prop == "LINK_DIRECTORIES")
    {
    output = cmJoin(this->GetLinkDirectories(), ";");
    return output.c_str();
    }
  else if (prop == "INCLUDE_DIRECTORIES")
    {
    std::string sep;
    for (std::vector<cmValueWithOrigin>::const_iterator
        it = this->IncludeDirectoriesEntries.begin(),
        end = this->IncludeDirectoriesEntries.end();
        it != end; ++it)
      {
      output += sep;
      output += it->Value;
      sep = ";";
      }
    return output.c_str();
    }
  else if (prop == "COMPILE_OPTIONS")
    {
    std::string sep;
    for (std::vector<cmValueWithOrigin>::const_iterator
        it = this->CompileOptionsEntries.begin(),
        end = this->CompileOptionsEntries.end();
        it != end; ++it)
      {
      output += sep;
      output += it->Value;
      sep = ";";
      }
    return output.c_str();
    }
  else if (prop == "COMPILE_DEFINITIONS")
    {
    std::string sep;
    for (std::vector<cmValueWithOrigin>::const_iterator
        it = this->CompileDefinitionsEntries.begin(),
        end = this->CompileDefinitionsEntries.end();
        it != end; ++it)
      {
      output += sep;
      output += it->Value;
      sep = ";";
      }
    return output.c_str();
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal && chain)
    {
    if(this->LocalGenerator->GetParent())
      {
      return this->LocalGenerator->GetParent()->GetMakefile()->
        GetProperty(prop, chain);
      }
    return this->GetState()->GetGlobalProperty(prop);
    }

  return retVal;
}